

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslellipticcurve.cpp
# Opt level: O2

QString * __thiscall
QSslEllipticCurve::shortName(QString *__return_storage_ptr__,QSslEllipticCurve *this)

{
  Data *pDVar1;
  QTlsBackend *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar2 != (QTlsBackend *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x118))(&local_38,pQVar2,this->id);
    pDVar1 = local_38.d;
    local_38.d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_38.ptr;
    local_38.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_38.size;
    local_38.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslEllipticCurve::shortName() const
{
    QString name;

    if (const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse())
        name = tlsBackend->shortNameForId(id);

    return name;
}